

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

void Dch_ClassesCheck(Dch_Cla_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  Aig_Obj_t *pAVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Aig_Obj_t *pAVar12;
  Aig_Obj_t *pAVar13;
  long lVar14;
  
  pAVar2 = p->pAig;
  iVar10 = pAVar2->vObjs->nSize;
  lVar9 = (long)iVar10;
  if (lVar9 < 1) {
    iVar6 = 0;
    iVar7 = 0;
  }
  else {
    lVar11 = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      ppAVar3 = p->pId2Class[lVar11];
      if (ppAVar3 != (Aig_Obj_t **)0x0) {
        pAVar12 = *ppAVar3;
        iVar1 = pAVar12->Id;
        if (0 < (long)p->pClassSizes[iVar1]) {
          lVar14 = 0;
          pAVar13 = (Aig_Obj_t *)0x0;
          do {
            pAVar4 = p->pId2Class[iVar1][lVar14];
            if (pAVar4 != (Aig_Obj_t *)0x0) {
              ppAVar3 = pAVar2->pReprs;
              if (lVar14 == 0) {
                pAVar13 = pAVar4;
                if ((ppAVar3 != (Aig_Obj_t **)0x0) && (ppAVar3[pAVar4->Id] != (Aig_Obj_t *)0x0)) {
                  __assert_fail("Aig_ObjRepr(p->pAig, pObj) == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                                ,0xfc,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
              }
              else {
                if (ppAVar3 == (Aig_Obj_t **)0x0) {
                  pAVar8 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar8 = ppAVar3[pAVar4->Id];
                }
                if (pAVar8 != pAVar12) {
                  __assert_fail("Aig_ObjRepr(p->pAig, pObj) == ppClass[0]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                                ,0xff,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
                if (pAVar4->Id <= pAVar13->Id) {
                  __assert_fail("pPrev->Id < pObj->Id",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                                ,0x100,"void Dch_ClassesCheck(Dch_Cla_t *)");
                }
                iVar7 = iVar7 + 1;
                pAVar13 = pAVar4;
              }
            }
            lVar14 = lVar14 + 1;
          } while (p->pClassSizes[iVar1] != lVar14);
        }
        iVar6 = iVar6 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar9);
    if (0 < iVar10) {
      lVar11 = 0;
      iVar10 = 0;
      do {
        pvVar5 = pAVar2->vObjs->pArray[lVar11];
        if (pvVar5 != (void *)0x0) {
          if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = pAVar2->pReprs[*(int *)((long)pvVar5 + 0x24)];
          }
          iVar10 = iVar10 + (uint)(pAVar12 == pAVar2->pConst1);
        }
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
      goto LAB_009080af;
    }
  }
  iVar10 = 0;
LAB_009080af:
  if (p->nLits != iVar7) {
    __assert_fail("p->nLits == nLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x10a,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nCands1 != iVar10) {
    __assert_fail("p->nCands1 == nCands1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x10b,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  if (p->nClasses != iVar6) {
    __assert_fail("p->nClasses == nClasses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                  ,0x10c,"void Dch_ClassesCheck(Dch_Cla_t *)");
  }
  return;
}

Assistant:

void Dch_ClassesCheck( Dch_Cla_t * p )
{
    Aig_Obj_t * pObj, * pPrev, ** ppClass;
    int i, k, nLits, nClasses, nCands1;
    nClasses = nLits = 0;
    Dch_ManForEachClass( p, ppClass, k )
    {
        pPrev = NULL;
        Dch_ClassForEachNode( p, ppClass[0], pObj, i )
        {
            if ( i == 0 )
                assert( Aig_ObjRepr(p->pAig, pObj) == NULL );
            else
            {
                assert( Aig_ObjRepr(p->pAig, pObj) == ppClass[0] );
                assert( pPrev->Id < pObj->Id );
                nLits++;
            }
            pPrev = pObj;
        }
        nClasses++;
    }
    nCands1 = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
        nCands1 += Dch_ObjIsConst1Cand( p->pAig, pObj );
    assert( p->nLits == nLits );
    assert( p->nCands1 == nCands1 );
    assert( p->nClasses == nClasses );
}